

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O0

int __thiscall QDialPrivate::bound(QDialPrivate *this,int val)

{
  int in_ESI;
  QAbstractSliderPrivate *in_RDI;
  int local_4;
  
  if (((byte)in_RDI[1].super_QWidgetPrivate.field_0x8 >> 1 & 1) == 0) {
    local_4 = QAbstractSliderPrivate::bound(in_RDI,in_ESI);
  }
  else if ((in_ESI < *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) ||
          (local_4 = in_ESI, in_RDI->maximum < in_ESI)) {
    if (*(int *)&(in_RDI->super_QWidgetPrivate).field_0x254 == in_RDI->maximum) {
      local_4 = *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254;
    }
    else {
      local_4 = *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254 +
                (in_ESI - *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) %
                (in_RDI->maximum - *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254);
      if (local_4 < *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) {
        local_4 = (in_RDI->maximum - *(int *)&(in_RDI->super_QWidgetPrivate).field_0x254) + local_4;
      }
    }
  }
  return local_4;
}

Assistant:

int QDialPrivate::bound(int val) const
{
    if (wrapping) {
        if ((val >= minimum) && (val <= maximum))
            return val;
        if (minimum == maximum)
            return minimum;
        val = minimum + ((val - minimum) % (maximum - minimum));
        if (val < minimum)
            val += maximum - minimum;
        return val;
    } else {
        return QAbstractSliderPrivate::bound(val);
    }
}